

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

void (anonymous_namespace)::test<ddd::DictionaryMLT<true,true>>
               (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs,
               unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               *dic)

{
  uint32_t *puVar1;
  DictionaryMLT<false,_false> *pDVar2;
  KvPair *pKVar3;
  uint __line;
  pointer ppKVar4;
  pointer ppKVar5;
  DictionaryMLT<false,_false> *pDVar6;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> *__range2_2;
  size_t i;
  ulong uVar10;
  char *__assertion;
  pointer pKVar11;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *__range2;
  pointer ppKVar12;
  pointer ppKVar13;
  pointer pKVar14;
  vector<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_> test_kvs [2];
  DictionaryMLT<false,_false> *local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  long lStack_240;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> ret;
  
  pKVar14 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pKVar11 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (pKVar14 == pKVar11) {
      pKVar14 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      pKVar11 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
                super__Vector_impl_data._M_start;
      goto LAB_0011bb86;
    }
    pDVar2 = (dic->_M_t).
             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
    iVar7 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[4])
                      (pDVar2,(pKVar14->key)._M_dataplus._M_p,(ulong)pKVar14->value);
    pKVar14 = pKVar14 + 1;
  } while ((char)iVar7 != '\0');
  __assertion = "dic->insert_key(kv.key.c_str(), kv.value)";
  __line = 0x3a;
  goto LAB_0011bf0a;
LAB_0011bb86:
  if (pKVar11 != pKVar14) {
    pDVar2 = (dic->_M_t).
             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
    uVar8 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                      (pDVar2,(pKVar11->key)._M_dataplus._M_p);
    puVar1 = &pKVar11->value;
    pKVar11 = pKVar11 + 1;
    if (uVar8 != *puVar1) goto code_r0x0011bba7;
    goto LAB_0011bb86;
  }
  ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pDVar2 = (dic->_M_t).
           super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
           .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
  (*(pDVar2->super_Dictionary)._vptr_Dictionary[10])(pDVar2,&ret);
  lVar9 = (long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)(lVar9 / 0x28)) {
    __assertion = "stat.num_keys == kvs.size()";
    __line = 0x42;
    goto LAB_0011bf0a;
  }
  ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pDVar2 = (dic->_M_t).
           super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
           .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
  (*(pDVar2->super_Dictionary)._vptr_Dictionary[6])(pDVar2,&ret,lVar9 % 0x28);
  if ((long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
            super__Vector_impl_data._M_start !=
      (long)ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
            super__Vector_impl_data._M_start) {
    __assertion = "kvs.size() == ret.size()";
    __line = 0x47;
    goto LAB_0011bf0a;
  }
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector(&ret);
  test_kvs[1].super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  test_kvs[1].super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_kvs[0].super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_kvs[1].super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  test_kvs[0].super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  test_kvs[0].super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = 0;
  for (uVar10 = 0;
      ppKVar4 = test_kvs[0].
                super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
      pKVar14 = (kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>)._M_impl.
                super__Vector_impl_data._M_start,
      ppKVar12 = test_kvs[0].
                 super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)(((long)(kvs->super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pKVar14) / 0x28);
      uVar10 = uVar10 + 1) {
    ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((long)&(pKVar14->key)._M_dataplus._M_p + lVar9);
    std::vector<ddd::KvPair_const*,std::allocator<ddd::KvPair_const*>>::
    emplace_back<ddd::KvPair_const*>
              ((vector<ddd::KvPair_const*,std::allocator<ddd::KvPair_const*>> *)
               (test_kvs + ((uint)uVar10 & 1)),(KvPair **)&ret);
    lVar9 = lVar9 + 0x28;
  }
  do {
    ppKVar5 = test_kvs[0].
              super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppKVar13 = test_kvs[0].
               super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppKVar12 == ppKVar4) goto LAB_0011bcfb;
    pKVar3 = *ppKVar12;
    pDVar2 = (dic->_M_t).
             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
    uVar8 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[5])(pDVar2,(pKVar3->key)._M_dataplus._M_p)
    ;
    ppKVar12 = ppKVar12 + 1;
  } while (uVar8 == pKVar3->value);
  __assertion = "dic->delete_key(kv->key.c_str()) == kv->value";
  __line = 0x50;
  goto LAB_0011bf0a;
code_r0x0011bba7:
  __assertion = "dic->search_key(kv.key.c_str()) == kv.value";
  __line = 0x3d;
  goto LAB_0011bf0a;
LAB_0011bcfb:
  while (ppKVar4 = test_kvs[1].
                   super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
        ppKVar12 = test_kvs[1].
                   super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                   _M_impl.super__Vector_impl_data._M_start, ppKVar13 != ppKVar5) {
    pDVar2 = (dic->_M_t).
             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
    iVar7 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                      (pDVar2,((*ppKVar13)->key)._M_dataplus._M_p);
    ppKVar13 = ppKVar13 + 1;
    if (iVar7 != -1) {
      __assertion = "dic->search_key(kv->key.c_str()) == NOT_FOUND";
      __line = 0x53;
      goto LAB_0011bf0a;
    }
  }
  do {
    if (ppKVar12 == ppKVar4) {
      std::ofstream::ofstream(&ret,"test.index",_S_out);
      pDVar2 = (dic->_M_t).
               super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
      (*(pDVar2->super_Dictionary)._vptr_Dictionary[0xc])(pDVar2,&ret);
      std::ofstream::~ofstream(&ret);
      std::ifstream::ifstream(&ret,"test.index",_S_in);
      std::istream::seekg((long)&ret,_S_beg);
      lVar9 = std::istream::tellg();
      local_248 = 0;
      lStack_240 = 0;
      local_258 = 0;
      uStack_250 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_288 = (DictionaryMLT<false,_false> *)0x0;
      uStack_280 = 0;
      (*(((dic->_M_t).
          super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
          .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
        super_Dictionary)._vptr_Dictionary[10])();
      if (lStack_240 != lVar9) {
        __assertion = "stat.size_in_bytes == size";
        __line = 100;
        goto LAB_0011bf0a;
      }
      std::ifstream::~ifstream(&ret);
      std::ifstream::ifstream(&ret,"test.index",_S_in);
      ddd::make_unique<ddd::DictionaryMLT<true,true>,std::ifstream&>
                ((ddd *)&local_288,(basic_ifstream<char,_std::char_traits<char>_> *)&ret);
      pDVar6 = local_288;
      local_288 = (DictionaryMLT<false,_false> *)0x0;
      pDVar2 = (dic->_M_t).
               super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
               .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
      (dic->_M_t).
      super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
      .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl = pDVar6;
      if ((pDVar2 != (DictionaryMLT<false,_false> *)0x0) &&
         ((*(pDVar2->super_Dictionary)._vptr_Dictionary[1])(),
         local_288 != (DictionaryMLT<false,_false> *)0x0)) {
        (*(local_288->super_Dictionary)._vptr_Dictionary[1])();
      }
      std::ifstream::~ifstream(&ret);
      (*(((dic->_M_t).
          super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
          .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
        super_Dictionary)._vptr_Dictionary[7])();
      ppKVar4 = test_kvs[0].
                super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppKVar12 = test_kvs[0].
                 super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      goto LAB_0011be93;
    }
    pKVar3 = *ppKVar12;
    pDVar2 = (dic->_M_t).
             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
    uVar8 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])(pDVar2,(pKVar3->key)._M_dataplus._M_p)
    ;
    ppKVar12 = ppKVar12 + 1;
  } while (uVar8 == pKVar3->value);
  __assertion = "dic->search_key(kv->key.c_str()) == kv->value";
  __line = 0x56;
  goto LAB_0011bf0a;
  while( true ) {
    pDVar2 = (dic->_M_t).
             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
    iVar7 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                      (pDVar2,((*ppKVar12)->key)._M_dataplus._M_p);
    ppKVar12 = ppKVar12 + 1;
    if (iVar7 != -1) break;
LAB_0011be93:
    ppKVar5 = test_kvs[1].
              super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppKVar13 = test_kvs[1].
               super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppKVar12 == ppKVar4) goto LAB_0011bed3;
  }
  __assertion = "dic->search_key(kv->key.c_str()) == NOT_FOUND";
  __line = 0x6f;
  goto LAB_0011bf0a;
  while( true ) {
    pKVar3 = *ppKVar13;
    pDVar2 = (dic->_M_t).
             super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
             .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
    uVar8 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])(pDVar2,(pKVar3->key)._M_dataplus._M_p)
    ;
    ppKVar13 = ppKVar13 + 1;
    if (uVar8 != pKVar3->value) break;
LAB_0011bed3:
    if (ppKVar13 == ppKVar5) {
      ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (*(((dic->_M_t).
          super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
          .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
        super_Dictionary)._vptr_Dictionary[10])();
      if (ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pointer)((long)test_kvs[1].
                          super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)test_kvs[1].
                          super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        std::ifstream::ifstream(&ret,"test.index",_S_in);
        ddd::make_unique<ddd::DictionaryMLT<true,true>,std::ifstream&>
                  ((ddd *)&local_288,(basic_ifstream<char,_std::char_traits<char>_> *)&ret);
        pDVar6 = local_288;
        local_288 = (DictionaryMLT<false,_false> *)0x0;
        pDVar2 = (dic->_M_t).
                 super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                 .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
        (dic->_M_t).
        super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
        .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl = pDVar6;
        if ((pDVar2 != (DictionaryMLT<false,_false> *)0x0) &&
           ((*(pDVar2->super_Dictionary)._vptr_Dictionary[1])(),
           local_288 != (DictionaryMLT<false,_false> *)0x0)) {
          (**(code **)(*(long *)local_288 + 8))();
        }
        std::ifstream::~ifstream(&ret);
        (*(((dic->_M_t).
            super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
            .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
          super_Dictionary)._vptr_Dictionary[8])();
        ppKVar4 = test_kvs[0].
                  super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        ppKVar12 = test_kvs[0].
                   super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        do {
          ppKVar5 = test_kvs[1].
                    super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          ppKVar13 = test_kvs[1].
                     super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (ppKVar12 == ppKVar4) {
            do {
              if (ppKVar13 == ppKVar5) {
                ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (*(((dic->_M_t).
                    super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                    .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl)->
                  super_Dictionary)._vptr_Dictionary[10])();
                if (ret.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    (pointer)((long)test_kvs[1].
                                    super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)test_kvs[1].
                                    super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                  __assert_fail("stat.num_keys == test_kvs[1].size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                                ,0x8a,
                                "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                               );
                }
                lVar9 = 0x18;
                do {
                  std::_Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>::
                  ~_Vector_base((_Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>
                                 *)((long)&test_kvs[0].
                                           super__Vector_base<const_ddd::KvPair_*,_std::allocator<const_ddd::KvPair_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar9));
                  lVar9 = lVar9 + -0x18;
                } while (lVar9 != -0x18);
                return;
              }
              pKVar3 = *ppKVar13;
              pDVar2 = (dic->_M_t).
                       super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                       .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
              uVar8 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                                (pDVar2,(pKVar3->key)._M_dataplus._M_p);
              ppKVar13 = ppKVar13 + 1;
            } while (uVar8 == pKVar3->value);
            __assert_fail("dic->search_key(kv->key.c_str()) == kv->value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                          ,0x85,
                          "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                         );
          }
          pDVar2 = (dic->_M_t).
                   super___uniq_ptr_impl<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ddd::DictionaryMLT<true,_true>_*,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                   .super__Head_base<0UL,_ddd::DictionaryMLT<true,_true>_*,_false>._M_head_impl;
          iVar7 = (*(pDVar2->super_Dictionary)._vptr_Dictionary[3])
                            (pDVar2,((*ppKVar12)->key)._M_dataplus._M_p);
          ppKVar12 = ppKVar12 + 1;
        } while (iVar7 == -1);
        __assert_fail("dic->search_key(kv->key.c_str()) == NOT_FOUND",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp"
                      ,0x82,
                      "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
                     );
      }
      __assertion = "stat.num_keys == test_kvs[1].size()";
      __line = 0x77;
      goto LAB_0011bf0a;
    }
  }
  __assertion = "dic->search_key(kv->key.c_str()) == kv->value";
  __line = 0x72;
LAB_0011bf0a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/Test.cpp",
                __line,
                "void (anonymous namespace)::test(const std::vector<KvPair> &, std::unique_ptr<T>) [T = ddd::DictionaryMLT<true, true>]"
               );
}

Assistant:

void test(const std::vector<KvPair>& kvs, std::unique_ptr<T> dic) {
  for (auto &kv : kvs) {
    assert(dic->insert_key(kv.key.c_str(), kv.value));
  }
  for (auto &kv : kvs) {
    assert(dic->search_key(kv.key.c_str()) == kv.value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == kvs.size());
  }
  {
    std::vector<KvPair> ret;
    dic->enumerate(ret);
    assert(kvs.size() == ret.size());
  }

  std::vector<const KvPair*> test_kvs[2];
  for (size_t i = 0; i < kvs.size(); ++i) {
    test_kvs[i % 2].push_back(&kvs[i]);
  }

  for (auto kv : test_kvs[0]) {
    assert(dic->delete_key(kv->key.c_str()) == kv->value);
  }
  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }

  const char* file_name = "test.index";
  {
    std::ofstream ofs{file_name};
    dic->write(ofs);
  }

  {
    std::ifstream ifs{file_name};
    auto size = static_cast<size_t>(ifs.seekg(0, std::ios::end).tellg());
    Stat stat{};
    dic->stat(stat);
    assert(stat.size_in_bytes == size);
  }

  {
    std::ifstream ifs{file_name};
    dic = make_unique<T>(ifs);
  }

  dic->pack();

  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == test_kvs[1].size());
  }

  {
    std::ifstream ifs{file_name};
    dic = make_unique<T>(ifs);
  }

  dic->rebuild();

  for (auto kv : test_kvs[0]) {
    assert(dic->search_key(kv->key.c_str()) == NOT_FOUND);
  }
  for (auto kv : test_kvs[1]) {
    assert(dic->search_key(kv->key.c_str()) == kv->value);
  }
  {
    Stat stat{};
    dic->stat(stat);
    assert(stat.num_keys == test_kvs[1].size());
  }
}